

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall smf::Binasc::processMidiTempoWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  byte bVar1;
  pointer pcVar2;
  ostream *poVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  
  if (1 < word->_M_string_length) {
    pcVar2 = (word->_M_dataplus)._M_p;
    bVar1 = pcVar2[1];
    if (((int)(char)bVar1 - 0x30U < 10) ||
       ((bVar1 < 0x2f && ((0x680000000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)))) {
      dVar5 = strtod(pcVar2 + 1,(char **)0x0);
      dVar6 = -dVar5;
      if (-dVar5 <= dVar5) {
        dVar6 = dVar5;
      }
      iVar4 = (int)(60000000.0 / dVar6 + 0.5);
      poVar3 = std::operator<<(out,(char)((uint)iVar4 >> 0x10));
      poVar3 = std::operator<<(poVar3,(char)((uint)iVar4 >> 8));
      std::operator<<(poVar3,(char)iVar4);
      return 1;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
  poVar3 = std::operator<<(poVar3,": \'t\' needs to be followed immediately by ");
  poVar3 = std::operator<<(poVar3,"a floating-point number");
  std::endl<char,std::char_traits<char>>(poVar3);
  return 0;
}

Assistant:

int Binasc::processMidiTempoWord(std::ostream& out, const std::string& word,
		int lineNum) {
	if (word.size() < 2) {
		std::cerr << "Error on line: " << lineNum
			  << ": 't' needs to be followed immediately by "
			  << "a floating-point number" << std::endl;
		return 0;
	}
	if (!(isdigit(word[1]) || word[1] == '.' || word[1] == '-'
			|| word[1] == '+')) {
		std::cerr << "Error on line: " << lineNum
			  << ": 't' needs to be followed immediately by "
			  << "a floating-point number" << std::endl;
		return 0;
	}
	double value = strtod(&word[1], NULL);

	if (value < 0.0) {
		value = -value;
	}

	int intval = int(60.0 * 1000000.0 / value + 0.5);

	uchar byte0 = intval & 0xff;
	uchar byte1 = (intval >>  8) & 0xff;
	uchar byte2 = (intval >> 16) & 0xff;
	out << byte2 << byte1 << byte0;
	return 1;
}